

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastV64S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  ushort *puVar2;
  ulong *puVar3;
  char *pcVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar4 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
  uVar7 = (ulong)ptr[1];
  if ((long)uVar7 < 0) {
    uVar8 = (long)ptr[2] << 7 | 0x7f;
    if ((long)uVar8 < 0) {
      uVar5 = (long)ptr[3] << 0xe | 0x3fff;
      if ((long)uVar5 < 0) {
        uVar8 = uVar8 & ((long)ptr[4] << 0x15 | 0x1fffffU);
        if ((long)uVar8 < 0) {
          uVar5 = uVar5 & ((long)ptr[5] << 0x1c | 0xfffffffU);
          if ((long)uVar5 < 0) {
            uVar8 = uVar8 & ((long)ptr[6] << 0x23 | 0x7ffffffffU);
            if ((long)uVar8 < 0) {
              uVar5 = uVar5 & ((long)ptr[7] << 0x2a | 0x3ffffffffffU);
              if ((long)uVar5 < 0) {
                uVar8 = uVar8 & ((long)ptr[8] << 0x31 | 0x1ffffffffffffU);
                if ((long)uVar8 < 0) {
                  uVar5 = uVar5 & ((ulong)(byte)ptr[9] << 0x38 | 0xffffffffffffff);
                  if ((long)uVar5 < 0) {
                    puVar2 = (ushort *)(ptr + 0xb);
                    if (ptr[10] != '\x01') {
                      if (ptr[10] < '\0') {
                        puVar2 = (ushort *)0x0;
                        goto LAB_002c453a;
                      }
                      if ((ptr[10] & 1U) == 0) {
                        uVar5 = uVar5 ^ 0x8000000000000000;
                      }
                    }
                  }
                  else {
                    puVar2 = (ushort *)(ptr + 10);
                  }
                }
                else {
                  puVar2 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar2 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar2 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar2 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar2 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar2 = (ushort *)(ptr + 4);
      }
      uVar8 = uVar8 & uVar5;
    }
    else {
      puVar2 = (ushort *)(ptr + 3);
    }
    uVar7 = uVar7 & uVar8;
  }
  else {
    puVar2 = (ushort *)(ptr + 2);
  }
LAB_002c453a:
  if (puVar2 == (ushort *)0x0) {
    pcVar4 = Error(msg,(char *)0x0,ctx,data,table,hasbits);
    return pcVar4;
  }
  puVar3 = (ulong *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar3 & 7) != 0) {
    AlignFail(puVar3);
  }
  *puVar3 = uVar7;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar2) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar6 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar6 & 3) != 0) {
        AlignFail();
      }
      *puVar6 = *puVar6 | (uint)hasbits | (uint)(1L << ((ulong)data.field_0 >> 0x10 & 0x3f));
    }
    return (char *)puVar2;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar2;
  if ((uVar1 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  pcVar4 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
  return pcVar4;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV64S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return FastVarintS1<uint64_t>(PROTOBUF_TC_PARAM_PASS);
}